

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 ActionMarkExplicit::multipleInteraction
               (vector<Varnode_*,_std::allocator<Varnode_*>_> *multlist)

{
  Varnode *this;
  bool bVar1;
  int4 iVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppVVar5;
  PcodeOp *pPVar6;
  Varnode *vn_1;
  OpCode local_68;
  int4 i_1;
  OpCode topopc;
  int4 j;
  Varnode *topvn;
  OpCode local_50;
  int4 maxparam;
  OpCode opc;
  PcodeOp *local_40;
  PcodeOp *op;
  Varnode *vn;
  undefined1 local_28 [4];
  int4 i;
  vector<Varnode_*,_std::allocator<Varnode_*>_> purgelist;
  vector<Varnode_*,_std::allocator<Varnode_*>_> *multlist_local;
  
  purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)multlist;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector
            ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28);
  vn._4_4_ = 0;
  do {
    uVar3 = (ulong)vn._4_4_;
    sVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size
                      ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)
                       purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar3) {
      for (vn_1._4_4_ = 0;
          sVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size
                            ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28),
          (ulong)(long)vn_1._4_4_ < sVar4; vn_1._4_4_ = vn_1._4_4_ + 1) {
        ppVVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                            ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28,
                             (long)vn_1._4_4_);
        this = *ppVVar5;
        Varnode::setExplicit(this);
        Varnode::clearImplied(this);
        Varnode::clearMark(this);
      }
      sVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size
                        ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28);
      std::vector<Varnode_*,_std::allocator<Varnode_*>_>::~vector
                ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28);
      return (int4)sVar4;
    }
    ppVVar5 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                        ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)
                         purgelist.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(long)vn._4_4_);
    op = (PcodeOp *)*ppVVar5;
    local_40 = Varnode::getDef((Varnode *)op);
    local_50 = PcodeOp::code(local_40);
    bVar1 = PcodeOp::isBoolOutput(local_40);
    if ((((bVar1) || (local_50 == CPUI_INT_ZEXT)) || (local_50 == CPUI_INT_SEXT)) ||
       (local_50 == CPUI_PTRADD)) {
      topvn._4_4_ = 2;
      iVar2 = PcodeOp::numInput(local_40);
      if (iVar2 < topvn._4_4_) {
        topvn._4_4_ = PcodeOp::numInput(local_40);
      }
      _topopc = (Varnode *)0x0;
      for (i_1 = 0; i_1 < topvn._4_4_; i_1 = i_1 + 1) {
        _topopc = PcodeOp::getIn(local_40,i_1);
        bVar1 = Varnode::isMark(_topopc);
        if (bVar1) {
          local_68 = CPUI_COPY;
          bVar1 = Varnode::isWritten(_topopc);
          if (bVar1) {
            pPVar6 = Varnode::getDef(_topopc);
            bVar1 = PcodeOp::isBoolOutput(pPVar6);
            if (bVar1) goto LAB_0065fe37;
            pPVar6 = Varnode::getDef(_topopc);
            local_68 = PcodeOp::code(pPVar6);
          }
          if (local_50 == CPUI_PTRADD) {
            if (local_68 == CPUI_PTRADD) {
              std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back
                        ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28,
                         (value_type *)&topopc);
            }
          }
          else {
            std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back
                      ((vector<Varnode_*,_std::allocator<Varnode_*>_> *)local_28,
                       (value_type *)&topopc);
          }
        }
LAB_0065fe37:
      }
    }
    vn._4_4_ = vn._4_4_ + 1;
  } while( true );
}

Assistant:

int4 ActionMarkExplicit::multipleInteraction(vector<Varnode *> &multlist)

{
  vector<Varnode *> purgelist;

  for(int4 i=0;i<multlist.size();++i) {
    Varnode *vn = multlist[i];	// All elements in this list should have a defining op
    PcodeOp *op = vn->getDef();
    OpCode opc = op->code();
    if (op->isBoolOutput() || (opc == CPUI_INT_ZEXT) || (opc == CPUI_INT_SEXT) || (opc == CPUI_PTRADD)) {
      int4 maxparam = 2;
      if (op->numInput() < maxparam)
	maxparam = op->numInput();
      Varnode *topvn = (Varnode *)0;
      for(int4 j=0;j<maxparam;++j) {
	topvn = op->getIn(j);
	if (topvn->isMark()) {	// We have a "multiple" interaction between -topvn- and -vn-
	  OpCode topopc = CPUI_COPY;
	  if (topvn->isWritten()) {
	    if (topvn->getDef()->isBoolOutput())
	      continue;		// Try not to make boolean outputs explicit
	    topopc = topvn->getDef()->code();
	  }
	  if (opc == CPUI_PTRADD) {
	    if (topopc == CPUI_PTRADD)
	      purgelist.push_back(topvn);
	  }
	  else
	    purgelist.push_back(topvn);
	}
      }
    }
  }

  for(int4 i=0;i<purgelist.size();++i) {
    Varnode *vn = purgelist[i];
    vn->setExplicit();
    vn->clearImplied();
    vn->clearMark();
  }
  return purgelist.size();
}